

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::solver_equalities_101coeff
          (solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  pointer pfVar2;
  longdouble *plVar3;
  int *__s;
  rc_data *__s_00;
  bound_factor *__s_01;
  undefined8 extraout_RAX;
  pointer *ppfVar4;
  int iVar5;
  long lVar6;
  pointer pfVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar9 = (ulong)(this->ap).m_rows_values.m_length;
  uVar10 = uVar9 << 4;
  plVar3 = (longdouble *)operator_new__(uVar10);
  memset(plVar3,0,uVar10);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar3;
  uVar9 = uVar9 << 2;
  __s = (int *)operator_new__(uVar9);
  memset(__s,0,uVar9);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)*(pointer *)
                 ((long)&(pmVar1->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl + 8) -
          *(long *)&(pmVar1->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl >> 3;
  lVar6 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  if (lVar6 != 0x28) {
    lVar6 = (lVar6 >> 3) * -0x3333333333333333 + -1;
    ppfVar4 = (pointer *)
              ((long)&pmVar1[1].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    do {
      uVar10 = (long)*ppfVar4 - (long)((_Vector_impl_data *)(ppfVar4 + -1))->_M_start >> 3;
      if (uVar9 <= uVar10) {
        uVar9 = uVar10;
      }
      ppfVar4 = ppfVar4 + 5;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  uVar9 = -(ulong)(uVar9 >> 0x3b != 0) | uVar9 << 5;
  __s_00 = (rc_data *)operator_new__(uVar9);
  memset(__s_00,0,uVar9);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
  ._M_head_impl = __s_00;
  uVar9 = (long)m_ * 8;
  if (m_ < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  __s_01 = (bound_factor *)operator_new__(uVar9);
  memset(__s_01,0,uVar9);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
  ._M_head_impl = __s_01;
  uVar9 = (long)m_ << 4;
  if (m_ < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  plVar3 = (longdouble *)operator_new__(uVar9);
  iVar5 = 0;
  memset(plVar3,0,uVar9);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar3;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    pmVar1 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      __s_01[uVar9].negative_factor = 0;
      __s_01[uVar9].value = pmVar1[uVar9].min;
      pfVar7 = *(pointer *)
                &pmVar1[uVar9].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar1[uVar9].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar7 != pfVar2) {
        piVar8 = __s + iVar5;
        do {
          if ((pfVar7->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_equalities_101coeff();
            goto LAB_00326236;
          }
          *piVar8 = pfVar7->factor;
          if (pfVar7->factor < 0) {
            __s_01[uVar9].negative_factor = __s_01[uVar9].negative_factor + 1;
          }
          pfVar7 = pfVar7 + 1;
          piVar8 = piVar8 + 1;
          iVar5 = iVar5 + 1;
        } while (pfVar7 != pfVar2);
      }
      if (pmVar1[uVar9].min != pmVar1[uVar9].max) {
LAB_00326236:
        itm::solver_equalities_101coeff();
        operator_delete__(__s_01);
        __s[0x1a] = 0;
        __s[0x1b] = 0;
        if (*(void **)(__s + 0x18) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x18));
        }
        __s[0x18] = 0;
        __s[0x19] = 0;
        if (*(void **)(__s + 0x16) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x16));
        }
        __s[0x16] = 0;
        __s[0x17] = 0;
        if (*(void **)(__s + 0x14) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x14));
        }
        __s[0x14] = 0;
        __s[0x15] = 0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        _Unwind_Resume(extraout_RAX);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }